

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_test.cpp
# Opt level: O1

void __thiscall Boolean_SimpleCubeRegression_Test::TestBody(Boolean_SimpleCubeRegression_Test *this)

{
  undefined1 uVar1;
  long lVar2;
  char *message;
  AssertionResult gtest_ar;
  Manifold result;
  Manifold local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  Message local_c0 [2];
  AssertHelper local_b0 [2];
  Manifold local_a0 [16];
  Manifold local_90 [16];
  Manifold local_80 [16];
  Manifold local_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  lVar2 = manifold::ManifoldParams();
  uVar1 = *(undefined1 *)(lVar2 + 1);
  lVar2 = manifold::ManifoldParams();
  *(undefined1 *)(lVar2 + 1) = 1;
  local_30 = 0x3ff0000000000000;
  uStack_28 = 0x3ff0000000000000;
  local_20 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_b0,0);
  manifold::Manifold::Rotate(-0.1,0.1,-1.0);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0x3ff0000000000000;
  local_38 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_80,0);
  manifold::Manifold::operator+(local_d0,(Manifold *)local_c0);
  local_60 = 0x3ff0000000000000;
  uStack_58 = 0x3ff0000000000000;
  local_50 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_a0,0);
  manifold::Manifold::Rotate(-0.1,-0.10000000000066571,-1.0);
  manifold::Manifold::operator-(local_70,local_d0);
  manifold::Manifold::~Manifold(local_90);
  manifold::Manifold::~Manifold(local_a0);
  manifold::Manifold::~Manifold(local_d0);
  manifold::Manifold::~Manifold(local_80);
  manifold::Manifold::~Manifold((Manifold *)local_c0);
  manifold::Manifold::~Manifold((Manifold *)local_b0);
  local_c0[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = manifold::Manifold::Status();
  local_b0[0].data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<manifold::Manifold::Error,manifold::Manifold::Error>
            ((internal *)local_d0,"result.Status()","Manifold::Error::NoError",(Error *)local_c0,
             (Error *)local_b0);
  if (local_d0[0] == (Manifold)0x0) {
    testing::Message::Message(local_c0);
    if (local_c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_c8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/boolean_test.cpp"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(local_b0,local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if ((long *)CONCAT44(local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_c8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,local_c8);
  }
  lVar2 = manifold::ManifoldParams();
  *(undefined1 *)(lVar2 + 1) = uVar1;
  manifold::Manifold::~Manifold(local_70);
  return;
}

Assistant:

TEST(Boolean, SimpleCubeRegression) {
  const bool selfIntersectionChecks = ManifoldParams().selfIntersectionChecks;
  ManifoldParams().selfIntersectionChecks = true;
  Manifold result =
      Manifold::Cube().Rotate(-0.10000000000000001, 0.10000000000000001, -1.) +
      Manifold::Cube() -
      Manifold::Cube().Rotate(-0.10000000000000001, -0.10000000000066571, -1.);
  EXPECT_EQ(result.Status(), Manifold::Error::NoError);
  ManifoldParams().selfIntersectionChecks = selfIntersectionChecks;
}